

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_queue_entry.cpp
# Opt level: O3

int __thiscall libtorrent::aux::bw_request::assign_bandwidth(bw_request *this)

{
  bandwidth_channel *pbVar1;
  int iVar2;
  int amount;
  long lVar3;
  int j_1;
  
  this->ttl = this->ttl + -1;
  amount = this->request_size - this->assigned;
  iVar2 = 0;
  if (amount != 0) {
    lVar3 = 0;
    do {
      pbVar1 = (this->channel).super_array<libtorrent::aux::bandwidth_channel_*,_10UL>._M_elems
               [lVar3];
      if (pbVar1 == (bandwidth_channel *)0x0) break;
      iVar2 = amount;
      if (((pbVar1->m_limit != 0) && ((long)pbVar1->tmp != 0)) &&
         (iVar2 = (int)(((long)pbVar1->distribute_quota * (long)this->priority) / (long)pbVar1->tmp)
         , amount < iVar2)) {
        iVar2 = amount;
      }
      amount = iVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    this->assigned = this->assigned + amount;
    lVar3 = 0;
    do {
      pbVar1 = (this->channel).super_array<libtorrent::aux::bandwidth_channel_*,_10UL>._M_elems
               [lVar3];
      if (pbVar1 == (bandwidth_channel *)0x0) {
        return amount;
      }
      bandwidth_channel::use_quota(pbVar1,amount);
      lVar3 = lVar3 + 1;
      iVar2 = amount;
    } while (lVar3 != 5);
  }
  return iVar2;
}

Assistant:

int bw_request::assign_bandwidth()
	{
		TORRENT_ASSERT(assigned < request_size);
		int quota = request_size - assigned;
		TORRENT_ASSERT(quota >= 0);
		--ttl;
		if (quota == 0) return quota;

		for (int j = 0; j < 5 && channel[j]; ++j)
		{
			if (channel[j]->throttle() == 0) continue;
			if (channel[j]->tmp == 0) continue;
			quota = std::min(int(std::int64_t(channel[j]->distribute_quota)
				* priority / channel[j]->tmp), quota);
		}
		assigned += quota;
		for (int j = 0; j < 5 && channel[j]; ++j)
			channel[j]->use_quota(quota);
		TORRENT_ASSERT(assigned <= request_size);
		return quota;
	}